

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::ParseArguments
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *cmd)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  string arg;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar5 = (byte *)(cmd->_M_dataplus)._M_p;
  bVar2 = *pbVar5;
  if (bVar2 == 0) {
    return __return_storage_ptr__;
  }
  bVar3 = pbVar5[1];
  if (bVar3 == 0) {
LAB_00170efa:
    bVar1 = false;
  }
  else {
    if (bVar3 != 0x3a || bVar2 == 0x2f) {
      if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
        if (bVar3 != 0x2f) {
          bVar3 = pbVar5[2];
          goto LAB_00170ee9;
        }
      }
      else if (bVar2 == 0x5c) {
joined_r0x00170edc:
        if (bVar3 == 0x5c) goto LAB_00170ef5;
      }
      goto LAB_00170efa;
    }
    bVar3 = pbVar5[2];
    if (bVar3 != 0x5c) {
      if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
LAB_00170ee9:
        if (bVar3 == 0x3a) {
          bVar3 = pbVar5[3];
          goto joined_r0x00170edc;
        }
      }
      goto LAB_00170efa;
    }
LAB_00170ef5:
    bVar1 = true;
  }
LAB_00170f0b:
  while ((bVar2 == 0x20 || (bVar2 == 9))) {
    pbVar4 = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
    bVar2 = *pbVar4;
  }
  local_50._M_string_length = 0;
  *local_50._M_dataplus._M_p = '\0';
  bVar2 = *pbVar5;
  if (bVar2 != 0x22) {
    if (bVar2 == 0x27) {
      while( true ) {
        pbVar4 = pbVar5 + 1;
        bVar2 = *pbVar4;
        if ((bVar2 == 0) || (bVar2 == 0x27)) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
        pbVar5 = pbVar4;
      }
      pbVar5 = pbVar5 + 2;
      if (bVar2 == 0) {
        pbVar5 = pbVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
      goto LAB_0017104c;
    }
    if (bVar2 != 0) {
      do {
        if (bVar2 == 0x5c) {
          if (bVar1) goto LAB_00170f69;
          if (pbVar5[1] == 0) goto LAB_00170f81;
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
          pbVar5 = pbVar5 + 2;
        }
        else {
          if ((bVar2 < 0x21) && ((0x100000201U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
          goto LAB_00171041;
LAB_00170f69:
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
LAB_00170f81:
          pbVar5 = pbVar5 + 1;
        }
        bVar2 = *pbVar5;
      } while( true );
    }
    goto LAB_00171057;
  }
  while( true ) {
    pbVar4 = pbVar5 + 1;
    bVar2 = *pbVar4;
    if ((bVar2 == 0) || (bVar2 == 0x22)) break;
    std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_50._M_string_length,0,'\x01');
    pbVar5 = pbVar4;
  }
  pbVar5 = pbVar5 + 2;
  if (bVar2 == 0) {
    pbVar5 = pbVar4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
LAB_0017104c:
  bVar2 = *pbVar5;
  if (bVar2 == 0) {
LAB_00171057:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  goto LAB_00170f0b;
LAB_00171041:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
  goto LAB_0017104c;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const std::string& cmd)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  const char* command = cmd.c_str();
  if (command[0] && command[1] &&
      ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
       (command[0] == '\"' && command[1] != '/' && command[2] == ':' &&
        command[3] == '\\') ||
       (command[0] == '\'' && command[1] != '/' && command[2] == ':' &&
        command[3] == '\\') ||
       (command[0] == '\\' && command[1] == '\\'))) {
    win_path = true;
  }
  // Split the command into an argv array.
  for (const char* c = command; *c;) {
    // Skip over whitespace.
    while (*c == ' ' || *c == '\t') {
      ++c;
    }
    arg.clear();
    if (*c == '"') {
      // Parse a quoted argument.
      ++c;
      while (*c && *c != '"') {
        arg.append(1, *c);
        ++c;
      }
      if (*c) {
        ++c;
      }
      args.push_back(arg);
    } else if (*c == '\'') {
      // Parse a quoted argument.
      ++c;
      while (*c && *c != '\'') {
        arg.append(1, *c);
        ++c;
      }
      if (*c) {
        ++c;
      }
      args.push_back(arg);
    } else if (*c) {
      // Parse an unquoted argument.
      while (*c && *c != ' ' && *c != '\t') {
        if (*c == '\\' && !win_path) {
          ++c;
          if (*c) {
            arg.append(1, *c);
            ++c;
          }
        } else {
          arg.append(1, *c);
          ++c;
        }
      }
      args.push_back(arg);
    }
  }

  return args;
}